

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall cs::instance_type::compile(instance_type *this,istream *in)

{
  bool bVar1;
  undefined4 uVar2;
  long *in_RSI;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ast;
  int ch;
  deque<char,_std::allocator<char>_> buff;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff30;
  deque<char,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  charset in_stack_ffffffffffffffcc;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_ffffffffffffffd0;
  deque<char,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  compiler_type *in_stack_ffffffffffffffe0;
  
  std::deque<char,_std::allocator<char>_>::deque((deque<char,_std::allocator<char>_> *)0x129921);
  uVar2 = std::istream::get();
  while( true ) {
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)in_RSI + *(long *)(*in_RSI + -0x18)));
    in_stack_ffffffffffffff24 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff24);
    if (!bVar1) break;
    std::deque<char,_std::allocator<char>_>::push_back
              ((deque<char,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (value_type_conflict *)in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff20 = std::istream::get();
  }
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)0x1299c4);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1299d7);
  std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1299df);
  compiler_type::clear_metadata((compiler_type *)0x1299e7);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1299fa);
  std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x129a02);
  compiler_type::build_ast
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffcc);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x129a2f);
  std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x129a37);
  compiler_type::code_gen
            ((compiler_type *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x129a50);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x129a63);
  std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x129a6b);
  compiler_type::utilize_metadata((compiler_type *)CONCAT44(uVar2,in_stack_ffffffffffffff30));
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            *)in_stack_ffffffffffffff70);
  std::deque<char,_std::allocator<char>_>::~deque(in_stack_ffffffffffffff70);
  return;
}

Assistant:

void instance_type::compile(std::istream &in)
	{
		// Read from file
		std::deque<char> buff;
		for (int ch = in.get(); in; ch = in.get())
			buff.push_back(ch);
		std::deque<std::deque<token_base *>> ast;
		// Compile
		context->compiler->clear_metadata();
		context->compiler->build_ast(buff, ast);
		context->compiler->code_gen(ast, statements);
		context->compiler->utilize_metadata();
	}